

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBuffer::commandsAfterCompute
          (MemoryQualifierInstanceBuffer *this,VkCommandBuffer cmdBuffer,
          VkDeviceSize bufferSizeInBytes)

{
  Buffer *this_00;
  VkBuffer *pVVar1;
  undefined1 local_60 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  DeviceInterface *deviceInterface;
  VkDeviceSize bufferSizeInBytes_local;
  VkCommandBuffer cmdBuffer_local;
  MemoryQualifierInstanceBuffer *this_local;
  
  shaderWriteBarrier.size =
       (VkDeviceSize)
       Context::getDeviceInterface
                 ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  this_00 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->super_MemoryQualifierInstanceBase).m_buffer.
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar1 = image::Buffer::get(this_00);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_60,0x40,0x2000,(VkBuffer)pVVar1->m_internal,0,
             bufferSizeInBytes);
  (**(code **)(*(long *)shaderWriteBarrier.size + 0x368))
            (shaderWriteBarrier.size,cmdBuffer,0x800,0x4000,0,0,0,1,local_60,0,0);
  return;
}

Assistant:

void MemoryQualifierInstanceBuffer::commandsAfterCompute (const VkCommandBuffer cmdBuffer, const VkDeviceSize bufferSizeInBytes) const
{
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	const VkBufferMemoryBarrier shaderWriteBarrier
		= makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
								  VK_ACCESS_HOST_READ_BIT,
								  m_buffer->get(),
								  0ull,
								  bufferSizeInBytes);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
}